

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.hpp
# Opt level: O0

StorageBlockInfo * __thiscall
Diligent::ShaderResourcesGL::GetStorageBlock(ShaderResourcesGL *this,Uint32 Index)

{
  Char *Message;
  char (*in_R8) [18];
  undefined1 local_38 [8];
  string msg;
  Uint32 Index_local;
  ShaderResourcesGL *this_local;
  
  msg.field_2._12_4_ = Index;
  if (this->m_NumStorageBlocks <= Index) {
    FormatString<char[22],unsigned_int,char[18]>
              ((string *)local_38,(Diligent *)"Storage block index (",
               (char (*) [22])((long)&msg.field_2 + 0xc),(uint *)") is out of range",in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetStorageBlock",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,299);
    std::__cxx11::string::~string((string *)local_38);
  }
  return this->m_StorageBlocks + (uint)msg.field_2._12_4_;
}

Assistant:

StorageBlockInfo& GetStorageBlock(Uint32 Index)
    {
        VERIFY(Index < m_NumStorageBlocks, "Storage block index (", Index, ") is out of range");
        return m_StorageBlocks[Index];
    }